

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O3

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  long offset;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  mode_t mVar5;
  int iVar6;
  wchar_t wVar7;
  char *pcVar8;
  la_int64_t lVar9;
  char *pcVar10;
  size_t sVar12;
  int *piVar13;
  void *__value;
  size_t size;
  __off_t _Var14;
  __off_t __offset;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  char *__s1;
  uint *puVar18;
  stat s;
  int stflags;
  int local_10e8;
  int local_10e4;
  char *local_10e0;
  ulong local_10d8;
  char *local_10d0;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_ff0 [1008];
  ssize_t sVar11;
  
  local_10e8 = fd;
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_entry_from_file");
  if (iVar2 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  pcVar8 = archive_entry_sourcepath(entry);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &local_10c8;
          iVar2 = lstat(pcVar8,(stat *)st);
          if (iVar2 != 0) {
            piVar13 = __errno_location();
            iVar2 = *piVar13;
            pcVar10 = "Can\'t lstat %s";
            goto LAB_00111822;
          }
        }
        else {
          st = &local_10c8;
          iVar2 = stat(pcVar8,(stat *)st);
          if (iVar2 != 0) {
            piVar13 = __errno_location();
            iVar2 = *piVar13;
            pcVar10 = "Can\'t stat %s";
LAB_00111822:
            archive_set_error(_a,iVar2,pcVar10,pcVar8);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar2 = fstat(fd,(stat *)st);
        if (iVar2 != 0) {
          piVar13 = __errno_location();
          iVar2 = *piVar13;
          pcVar8 = "Can\'t fstat";
          goto LAB_0011166b;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar9 = archive_entry_uid(entry);
  pcVar10 = archive_read_disk_uname(_a,lVar9);
  if (pcVar10 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar10);
  }
  lVar9 = archive_entry_gid(entry);
  pcVar10 = archive_read_disk_gname(_a,lVar9);
  if (pcVar10 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar10);
  }
  local_10e4 = fd;
  if ((((ulong)_a[1].error_string.s & 0x40) == 0) && ((st->st_mode & 0xf000) == 0x4000)) {
    if (local_10e8 < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e8 = open(pcVar8,0x80800);
      }
      else {
        local_10e8 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar8,0x80800);
      }
      __archive_ensure_cloexec_flag(local_10e8);
      if (local_10e8 < 0) goto LAB_0011160e;
    }
    iVar2 = ioctl(local_10e8,0x80086601,local_1038);
    fd = local_10e4;
    if ((int)local_1038[0] != 0 && iVar2 == 0) {
      archive_entry_set_fflags(entry,(long)(int)local_1038[0],0);
      fd = local_10e4;
    }
  }
LAB_0011160e:
  if ((st->st_mode & 0xf000) == 0xa000) {
    sVar12 = st->st_size;
    pcVar10 = (char *)malloc(sVar12 + 1);
    if (pcVar10 == (char *)0x0) {
      pcVar8 = "Couldn\'t read link data";
      iVar2 = 0xc;
LAB_0011166b:
      archive_set_error(_a,iVar2,pcVar8);
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar11 = readlink(pcVar8,pcVar10,sVar12);
      uVar3 = (uint)sVar11;
    }
    else {
      iVar2 = (**(code **)&_a[1].file_count)();
      sVar11 = readlinkat(iVar2,pcVar8,pcVar10,sVar12);
      uVar3 = (uint)sVar11;
    }
    if ((int)uVar3 < 0) {
      piVar13 = __errno_location();
      archive_set_error(_a,*piVar13,"Couldn\'t read link data");
      free(pcVar10);
      return -0x19;
    }
    pcVar10[uVar3 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar10);
    free(pcVar10);
    fd = local_10e4;
  }
  iVar2 = 0;
  if (((ulong)_a[1].error_string.s & 0x10) == 0) {
    if (local_10e8 < 0) {
      pcVar8 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10e8);
      if (pcVar8 != (char *)0x0) {
        if (-1 < local_10e8) goto LAB_001116cb;
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          sVar12 = llistxattr(pcVar8,(char *)0x0,0);
        }
        else {
          sVar12 = listxattr(pcVar8,(char *)0x0,0);
        }
        goto LAB_001116d4;
      }
LAB_001117b4:
      iVar2 = -0x14;
    }
    else {
      pcVar8 = (char *)0x0;
LAB_001116cb:
      sVar12 = flistxattr(local_10e8,(char *)0x0,0);
LAB_001116d4:
      iVar4 = 0;
      iVar2 = 0;
      fd = local_10e4;
      if (sVar12 != 0) {
        iVar2 = iVar4;
        if (sVar12 == 0xffffffffffffffff) {
          piVar13 = __errno_location();
          fd = local_10e4;
          iVar4 = *piVar13;
          if ((iVar4 != 0x26) && (iVar4 != 0x5f)) {
            archive_set_error(_a,iVar4,"Couldn\'t list extended attributes");
            goto LAB_001117b4;
          }
        }
        else {
          local_10e0 = (char *)malloc(sVar12);
          if (local_10e0 == (char *)0x0) {
            piVar13 = __errno_location();
            archive_set_error(_a,*piVar13,"Out of memory");
            iVar2 = -0x1e;
            fd = local_10e4;
          }
          else {
            if (local_10e8 < 0) {
              if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
                uVar16 = llistxattr(pcVar8,local_10e0,sVar12);
              }
              else {
                uVar16 = listxattr(pcVar8,local_10e0,sVar12);
              }
            }
            else {
              uVar16 = flistxattr(local_10e8,local_10e0,sVar12);
            }
            if (uVar16 == 0xffffffffffffffff) {
              piVar13 = __errno_location();
              archive_set_error(_a,*piVar13,"Couldn\'t retrieve extended attributes");
              free(local_10e0);
              iVar2 = -0x14;
              fd = local_10e4;
            }
            else {
              pcVar10 = local_10e0;
              __s1 = local_10e0;
              local_10d0 = pcVar8;
              if (0 < (long)uVar16) {
                do {
                  local_10d8 = uVar16;
                  iVar4 = strncmp(__s1,"system.",7);
                  if (iVar4 == 0) {
                    iVar4 = strcmp(__s1 + 7,"posix_acl_access");
                    if ((iVar4 != 0) && (iVar4 = strcmp(__s1 + 7,"posix_acl_default"), iVar4 != 0))
                    goto LAB_00111892;
                  }
                  else {
LAB_00111892:
                    iVar4 = strncmp(__s1,"trusted.SGI_",0xc);
                    if (iVar4 == 0) {
                      iVar4 = strcmp(__s1 + 0xc,"ACL_DEFAULT");
                      if ((iVar4 == 0) || (iVar4 = strcmp(__s1 + 0xc,"ACL_FILE"), iVar4 == 0))
                      goto LAB_00111a53;
                    }
                    iVar6 = strncmp(__s1,"xfsroot.",8);
                    iVar4 = local_10e8;
                    if (iVar6 != 0) {
                      if (local_10e8 < 0) {
                        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
                          sVar12 = lgetxattr(local_10d0,__s1,(void *)0x0,0);
                        }
                        else {
                          sVar12 = getxattr(local_10d0,__s1,(void *)0x0,0);
                        }
                      }
                      else {
                        sVar12 = fgetxattr(local_10e8,__s1,(void *)0x0,0);
                      }
                      if (sVar12 == 0xffffffffffffffff) {
                        piVar13 = __errno_location();
                        iVar4 = *piVar13;
                        pcVar8 = "Couldn\'t query extended attribute";
LAB_001119ba:
                        archive_set_error(_a,iVar4,pcVar8);
                        pcVar10 = local_10e0;
                      }
                      else {
                        if ((long)sVar12 < 1) {
                          __value = (void *)0x0;
                        }
                        else {
                          __value = malloc(sVar12);
                          if (__value == (void *)0x0) {
                            piVar13 = __errno_location();
                            iVar4 = *piVar13;
                            pcVar8 = "Out of memory";
                            goto LAB_001119ba;
                          }
                        }
                        if (iVar4 < 0) {
                          if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
                            size = lgetxattr(local_10d0,__s1,__value,sVar12);
                          }
                          else {
                            size = getxattr(local_10d0,__s1,__value,sVar12);
                          }
                        }
                        else {
                          size = fgetxattr(iVar4,__s1,__value,sVar12);
                        }
                        pcVar10 = local_10e0;
                        if (size == 0xffffffffffffffff) {
                          piVar13 = __errno_location();
                          archive_set_error(_a,*piVar13,"Couldn\'t read extended attribute");
                        }
                        else {
                          archive_entry_xattr_add_entry(entry,__s1,__value,size);
                        }
                        free(__value);
                      }
                    }
                  }
LAB_00111a53:
                  sVar12 = strlen(__s1);
                  __s1 = __s1 + sVar12 + 1;
                  uVar16 = local_10d8;
                } while ((long)__s1 - (long)pcVar10 < (long)local_10d8);
              }
              free(pcVar10);
              fd = local_10e4;
            }
          }
        }
      }
    }
  }
  if (((ulong)_a[1].error_string.s & 0x80) != 0) goto LAB_00111f0f;
  mVar5 = archive_entry_filetype(entry);
  iVar4 = 0;
  if (((mVar5 == 0x8000) && (lVar9 = archive_entry_size(entry), 0 < lVar9)) &&
     (pcVar8 = archive_entry_hardlink(entry), pcVar8 == (char *)0x0)) {
    if ((local_10e8 < 0) &&
       (pcVar8 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10e8),
       local_10e8 < 0)) {
      iVar4 = -0x19;
      fd = local_10e4;
      if (pcVar8 != (char *)0x0) {
        local_10e8 = open(pcVar8,0x80800);
        if (-1 < local_10e8) {
          __archive_ensure_cloexec_flag(local_10e8);
          pcVar8 = (char *)0x0;
          goto LAB_00111b3a;
        }
LAB_00111ee9:
        iVar4 = -0x19;
        piVar13 = __errno_location();
        archive_set_error(_a,*piVar13,"Can\'t open `%s\'",pcVar8);
        fd = local_10e4;
      }
    }
    else {
      pcVar10 = (char *)lseek(local_10e8,0,1);
      pcVar8 = (char *)0x0;
      if (pcVar10 != (char *)0x0) {
        lseek(local_10e8,0,0);
        pcVar8 = pcVar10;
      }
LAB_00111b3a:
      _Var14 = lseek(local_10e8,0,4);
      if (_Var14 < 0) {
        mVar5 = archive_entry_filetype(entry);
        iVar4 = 0;
        fd = local_10e4;
        if (((mVar5 == 0x8000) &&
            (lVar9 = archive_entry_size(entry), iVar4 = 0, fd = local_10e4, 0 < lVar9)) &&
           (pcVar8 = archive_entry_hardlink(entry), fd = local_10e4, pcVar8 == (char *)0x0)) {
          if (local_10e8 < 0) {
            pcVar8 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,(int *)0x0);
            iVar4 = -0x19;
            fd = local_10e4;
            if (pcVar8 == (char *)0x0) goto LAB_00111f08;
            if (*(long *)&_a[1].archive_format == 0) {
              local_10e8 = open(pcVar8,0x80800);
            }
            else {
              local_10e8 = (*(code *)_a[1].archive_format_name)
                                     (*(long *)&_a[1].archive_format,pcVar8,0x80800);
            }
            if (local_10e8 < 0) goto LAB_00111ee9;
            __archive_ensure_cloexec_flag(local_10e8);
          }
          iVar4 = 0;
          memset(local_1038,0,0x1000);
          local_1038[1] = 0xffffffffffffffff;
          local_1028 = 1;
          local_1020 = 0x48;
          local_10d8 = archive_entry_size(entry);
          iVar6 = ioctl(local_10e8,0xc020660b,local_1038);
          fd = local_10e4;
          if (-1 < iVar6) {
            local_10e0 = (char *)((ulong)local_10e0 & 0xffffffff00000000);
            do {
              if (local_1024 == 0) {
                if ((int)local_10e0 == 0) {
                  iVar4 = 0;
                  archive_entry_sparse_add_entry(entry,0,0);
                  fd = local_10e4;
                }
                else {
LAB_00111f36:
                  iVar4 = 0;
                  fd = local_10e4;
                }
                break;
              }
              uVar3 = local_1024;
              if (0 < (int)local_1024) {
                bVar1 = true;
                iVar6 = 0;
                puVar18 = local_ff0;
                do {
                  uVar15 = *puVar18;
                  if ((uVar15 >> 0xb & 1) == 0) {
                    offset = *(long *)(puVar18 + -10);
                    uVar16 = offset + *(long *)(puVar18 + -6);
                    iVar4 = 0;
                    lVar17 = 0;
                    if (local_10d8 <= uVar16) {
                      lVar17 = uVar16 - local_10d8;
                    }
                    uVar16 = *(long *)(puVar18 + -6) - lVar17;
                    fd = local_10e4;
                    if (uVar16 == local_10d8 && offset == 0) goto LAB_00111f08;
                    if (0 < (long)uVar16) {
                      archive_entry_sparse_add_entry(entry,offset,uVar16);
                      uVar15 = *puVar18;
                      uVar3 = local_1024;
                    }
                  }
                  if ((uVar15 & 1) != 0) {
                    bVar1 = false;
                  }
                  iVar6 = iVar6 + 1;
                  puVar18 = puVar18 + 0xe;
                } while (iVar6 < (int)uVar3);
                if (!bVar1) goto LAB_00111f36;
              }
              local_1038[0] =
                   local_1038[(ulong)uVar3 * 7 + -1] + local_10c8.__glibc_reserved[(ulong)uVar3 * 7]
              ;
              local_10e0 = (char *)CONCAT44(local_10e0._4_4_,(int)local_10e0 + 1);
              iVar4 = 0;
              iVar6 = ioctl(local_10e8,0xc020660b,local_1038);
              fd = local_10e4;
            } while (-1 < iVar6);
          }
        }
      }
      else {
        local_10e0 = pcVar8;
        if (_Var14 != 0) {
          lseek(local_10e8,0,0);
        }
        lVar9 = archive_entry_size(entry);
        if (lVar9 < 1) {
LAB_00111dc3:
          local_10d8 = 0;
        }
        else {
          _Var14 = 0;
          while (__offset = lseek(local_10e8,_Var14,3), __offset != -1) {
            _Var14 = lseek(local_10e8,__offset,4);
            if (_Var14 == -1) {
              piVar13 = __errno_location();
              iVar4 = *piVar13;
              if (iVar4 == 6) {
                local_10d8 = 0;
                _Var14 = lseek(local_10e8,0,2);
                if (_Var14 != -1) goto LAB_00111e21;
                iVar4 = *piVar13;
              }
              pcVar8 = "lseek(SEEK_DATA) failed";
              goto LAB_00111e0d;
            }
            local_10d8 = 0;
            if ((_Var14 == lVar9 && __offset == 0) ||
               (archive_entry_sparse_add_entry(entry,__offset,_Var14 - __offset), lVar9 <= _Var14))
            goto LAB_00111e21;
          }
          piVar13 = __errno_location();
          iVar4 = *piVar13;
          if (iVar4 == 6) {
            wVar7 = archive_entry_sparse_count(entry);
            if (wVar7 != L'\0') goto LAB_00111dc3;
            local_10d8 = 0;
            _Var14 = lseek(local_10e8,0,4);
            if (_Var14 == 0) {
              local_10d8 = 0;
              _Var14 = lseek(local_10e8,0,2);
              if (_Var14 == lVar9) {
                local_10d8 = 0;
                archive_entry_sparse_add_entry(entry,0,0);
              }
            }
          }
          else {
            pcVar8 = "lseek(SEEK_HOLE) failed";
LAB_00111e0d:
            archive_set_error(_a,iVar4,pcVar8);
            local_10d8 = 0xffffffe7;
          }
        }
LAB_00111e21:
        lseek(local_10e8,(__off_t)local_10e0,0);
        iVar4 = (int)local_10d8;
        fd = local_10e4;
      }
    }
  }
LAB_00111f08:
  if (iVar4 < iVar2) {
    iVar2 = iVar4;
  }
LAB_00111f0f:
  if (local_10e8 != fd) {
    close(local_10e8);
  }
  return iVar2;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC, ARCHIVE_STATE_ANY,
		"archive_read_disk_entry_from_file");

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (la_stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len + 1);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = '\0';
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if ((a->flags & ARCHIVE_READDISK_NO_SPARSE) == 0) {
		r1 = setup_sparse(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}